

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketConnection.cpp
# Opt level: O2

void __thiscall
FIX::SocketConnection::SocketConnection
          (SocketConnection *this,socket_handle s,Sessions *sessions,SocketMonitor *pMonitor)

{
  __fd_mask *p_Var1;
  uint __i;
  long lVar2;
  
  (this->super_Responder)._vptr_Responder = (_func_int **)&PTR__SocketConnection_001f04e0;
  this->m_socket = s;
  (this->m_parser).m_buffer._M_dataplus._M_p = (pointer)&(this->m_parser).m_buffer.field_2;
  (this->m_parser).m_buffer._M_string_length = 0;
  (this->m_parser).m_buffer.field_2._M_local_buf[0] = '\0';
  std::
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Deque_base(&(this->m_sendQueue).
                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               );
  this->m_sendLength = 0;
  std::
  _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
  ::_Rb_tree(&(this->m_sessions)._M_t,&sessions->_M_t);
  this->m_pSession = (Session *)0x0;
  this->m_pMonitor = pMonitor;
  Mutex::Mutex(&this->m_mutex);
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
    (this->m_fds).fds_bits[lVar2] = 0;
  }
  p_Var1 = (this->m_fds).fds_bits + this->m_socket / 0x40;
  *p_Var1 = *p_Var1 | 1L << ((byte)this->m_socket & 0x3f);
  return;
}

Assistant:

SocketConnection::SocketConnection(socket_handle s, Sessions sessions,
                                    SocketMonitor* pMonitor )
: m_socket( s ), m_sendLength( 0 ),
  m_sessions(sessions), m_pSession( 0 ), m_pMonitor( pMonitor )
{
  FD_ZERO( &m_fds );
  FD_SET( m_socket, &m_fds );
}